

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perspective.h
# Opt level: O0

void __thiscall
phyr::PerspectiveCamera::PerspectiveCamera
          (PerspectiveCamera *this,Transform *cameraToWorld,Bounds2f *screenBounds,double lensRadius
          ,double focalDistance,double fov,Film *film)

{
  undefined8 *in_RCX;
  undefined8 *in_RDI;
  Point3<double> *this_00;
  undefined8 extraout_XMM0_Qa;
  Point3f pMax;
  Point3f pMin;
  Point2i res;
  double in_stack_00000100;
  double in_stack_00000108;
  double in_stack_00000110;
  Film *in_stack_00000660;
  double in_stack_00000668;
  double in_stack_00000670;
  Bounds2f *in_stack_00000678;
  Transform *in_stack_00000680;
  Transform *in_stack_00000688;
  ProjectiveCamera *in_stack_00000690;
  Point3<double> local_1b0;
  Point3<double> *in_stack_fffffffffffffe78;
  Transform *in_stack_fffffffffffffe80;
  Point3<double> local_170;
  Point3<double> local_158;
  undefined8 local_140;
  undefined8 *local_38;
  
  local_38 = in_RCX;
  Transform::perspective(in_stack_00000110,in_stack_00000108,in_stack_00000100);
  ProjectiveCamera::ProjectiveCamera
            (in_stack_00000690,in_stack_00000688,in_stack_00000680,in_stack_00000678,
             in_stack_00000670,in_stack_00000668,in_stack_00000660);
  *in_RDI = &PTR__PerspectiveCamera_0028af88;
  local_140 = *local_38;
  Point3<double>::Point3(&local_170,0.0,0.0,0.0);
  Transform::operator()(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  Point3<double>::Point3(&local_1b0,(double)(int)local_140,(double)local_140._4_4_,0.0);
  Transform::operator()(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  Point3<double>::operator/=(&local_158,local_158.z);
  this_00 = (Point3<double> *)&stack0xfffffffffffffe68;
  Point3<double>::operator/=(this_00,(double)in_stack_fffffffffffffe78);
  std::abs((int)this_00);
  in_RDI[0xa4] = extraout_XMM0_Qa;
  return;
}

Assistant:

PerspectiveCamera(const Transform& cameraToWorld, const Bounds2f& screenBounds,
                      Real lensRadius, Real focalDistance, Real fov, Film* film) :
        ProjectiveCamera(cameraToWorld, Transform::perspective(fov, 1e-2f, 1000.0f),
                         screenBounds, lensRadius, focalDistance, film) {
        // Compute image plane bounds
        Point2i res = film->resolution;
        Point3f pMin = rasterToCamera(Point3f(0, 0, 0));
        Point3f pMax = rasterToCamera(Point3f(res.x, res.y, 0));

        // Z - divide
        pMin /= pMin.z; pMax /= pMax.z;
        imagePlaneArea = std::abs((pMax.x - pMin.x) * (pMax.y - pMin.y));
    }